

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.cpp
# Opt level: O2

int duckdb_lz4::LZ4_decompress_unsafe_generic
              (BYTE *istart,BYTE *ostart,int decompressedSize,size_t prefixSize,BYTE *dictStart,
              size_t dictSize)

{
  ushort uVar1;
  size_t sVar2;
  long lVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  BYTE *__src;
  BYTE *pBVar7;
  BYTE *__dest;
  ushort *puVar8;
  ulong uVar9;
  ushort *local_58;
  long local_50;
  BYTE *local_48;
  BYTE *local_40;
  size_t local_38;
  
  pBVar7 = ostart + decompressedSize;
  local_50 = (long)ostart - prefixSize;
  local_40 = dictStart + dictSize;
  local_58 = (ushort *)istart;
  local_48 = istart;
  local_38 = dictSize;
  while( true ) {
    puVar8 = (ushort *)((long)local_58 + 1);
    uVar1 = *local_58;
    uVar4 = (uint)(byte)((byte)uVar1 >> 4);
    uVar5 = (ulong)uVar4;
    local_58 = puVar8;
    if (uVar4 == 0xf) {
      sVar2 = read_long_length_no_check((BYTE **)&local_58);
      uVar5 = sVar2 + 0xf;
    }
    puVar8 = local_58;
    if ((ulong)((long)pBVar7 - (long)ostart) < uVar5) {
      return -1;
    }
    memmove(ostart,local_58,uVar5);
    __dest = ostart + uVar5;
    puVar8 = (ushort *)((long)puVar8 + uVar5);
    if ((ulong)((long)pBVar7 - (long)__dest) < 0xc) {
      if (__dest == pBVar7) {
        return (int)puVar8 - (int)local_48;
      }
      return -1;
    }
    uVar5 = (ulong)((byte)uVar1 & 0xf);
    uVar9 = (ulong)*puVar8;
    local_58 = puVar8 + 1;
    if (uVar5 == 0xf) {
      sVar2 = read_long_length_no_check((BYTE **)&local_58);
      uVar5 = sVar2 + 0xf;
    }
    uVar5 = uVar5 + 4;
    if ((ulong)((long)pBVar7 - (long)__dest) < uVar5) break;
    uVar6 = (long)__dest - local_50;
    if (local_38 + uVar6 < uVar9) {
      return -1;
    }
    if (uVar6 < uVar9) {
      __src = local_40 + (uVar6 - uVar9);
      uVar9 = (long)local_40 - (long)__src;
      if (uVar5 < uVar9) {
        memmove(__dest,__src,uVar5);
        uVar9 = uVar5;
        uVar5 = 0;
      }
      else {
        memmove(__dest,__src,uVar9);
        uVar5 = uVar5 - uVar9;
      }
      __dest = __dest + uVar9;
      lVar3 = local_50;
    }
    else {
      lVar3 = (long)__dest - uVar9;
    }
    for (uVar9 = 0; uVar5 != uVar9; uVar9 = uVar9 + 1) {
      __dest[uVar9] = *(BYTE *)(lVar3 + uVar9);
    }
    ostart = __dest + uVar5;
    if ((ulong)((long)pBVar7 - (long)ostart) < 5) {
      return -1;
    }
  }
  return -1;
}

Assistant:

LZ4_FORCE_INLINE int
LZ4_decompress_unsafe_generic(
                 const BYTE* const istart,
                 BYTE* const ostart,
                 int decompressedSize,

                 size_t prefixSize,
                 const BYTE* const dictStart,  /* only if dict==usingExtDict */
                 const size_t dictSize         /* note: =0 if dictStart==NULL */
                 )
{
    const BYTE* ip = istart;
    BYTE* op = (BYTE*)ostart;
    BYTE* const oend = ostart + decompressedSize;
    const BYTE* const prefixStart = ostart - prefixSize;

    DEBUGLOG(5, "LZ4_decompress_unsafe_generic");
    if (dictStart == NULL) assert(dictSize == 0);

    while (1) {
        /* start new sequence */
        unsigned token = *ip++;

        /* literals */
        {   size_t ll = token >> ML_BITS;
            if (ll==15) {
                /* long literal length */
                ll += read_long_length_no_check(&ip);
            }
            if ((size_t)(oend-op) < ll) return -1; /* output buffer overflow */
            LZ4_memmove(op, ip, ll); /* support in-place decompression */
            op += ll;
            ip += ll;
            if ((size_t)(oend-op) < MFLIMIT) {
                if (op==oend) break;  /* end of block */
                DEBUGLOG(5, "invalid: literals end at distance %zi from end of block", oend-op);
                /* incorrect end of block :
                 * last match must start at least MFLIMIT==12 bytes before end of output block */
                return -1;
        }   }

        /* match */
        {   size_t ml = token & 15;
            size_t const offset = LZ4_readLE16(ip);
            ip+=2;

            if (ml==15) {
                /* long literal length */
                ml += read_long_length_no_check(&ip);
            }
            ml += MINMATCH;

            if ((size_t)(oend-op) < ml) return -1; /* output buffer overflow */

            {   const BYTE* match = op - offset;

                /* out of range */
                if (offset > (size_t)(op - prefixStart) + dictSize) {
                    DEBUGLOG(6, "offset out of range");
                    return -1;
                }

                /* check special case : extDict */
                if (offset > (size_t)(op - prefixStart)) {
                    /* extDict scenario */
                    const BYTE* const dictEnd = dictStart + dictSize;
                    const BYTE* extMatch = dictEnd - (offset - (size_t)(op-prefixStart));
                    size_t const extml = (size_t)(dictEnd - extMatch);
                    if (extml > ml) {
                        /* match entirely within extDict */
                        LZ4_memmove(op, extMatch, ml);
                        op += ml;
                        ml = 0;
                    } else {
                        /* match split between extDict & prefix */
                        LZ4_memmove(op, extMatch, extml);
                        op += extml;
                        ml -= extml;
                    }
                    match = prefixStart;
                }

                /* match copy - slow variant, supporting overlap copy */
                {   size_t u;
                    for (u=0; u<ml; u++) {
                        op[u] = match[u];
            }   }   }
            op += ml;
            if ((size_t)(oend-op) < LASTLITERALS) {
                DEBUGLOG(5, "invalid: match ends at distance %zi from end of block", oend-op);
                /* incorrect end of block :
                 * last match must stop at least LASTLITERALS==5 bytes before end of output block */
                return -1;
            }
        } /* match */
    } /* main loop */
    return (int)(ip - istart);
}